

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmTargetSelectLinker::Choose_abi_cxx11_(string *__return_storage_ptr__,cmTargetSelectLinker *this)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  cmTarget *pcVar3;
  long lVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  cmake *this_00;
  ostringstream e;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [376];
  
  sVar2 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar2 != 1) {
    if (sVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target ",7);
    pcVar3 = this->Target->Target;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(pcVar3->Name)._M_dataplus._M_p,
                        (pcVar3->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," contains multiple languages with the highest linker preference",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->Preference);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):\n",3);
    p_Var6 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->Preferred)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Set the LINKER_LANGUAGE property for this target.",0x31);
    this_00 = cmLocalGenerator::GetCMakeInstance(this->Target->LocalGenerator);
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d8);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_1d8 + 0x10),
                        (cmListFileBacktrace *)local_1d8);
    if ((cmMakefile *)local_1d8._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._16_8_ != &local_1b8) {
      operator_delete((void *)local_1d8._16_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  p_Var6 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar4 = *(long *)(p_Var6 + 1);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar4,(long)&(p_Var6[1]._M_parent)->_M_color + lVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string Choose()
  {
    if (this->Preferred.empty()) {
      return "";
    }
    if (this->Preferred.size() > 1) {
      std::ostringstream e;
      e << "Target " << this->Target->GetName()
        << " contains multiple languages with the highest linker preference"
        << " (" << this->Preference << "):\n";
      for (std::string const& li : this->Preferred) {
        e << "  " << li << "\n";
      }
      e << "Set the LINKER_LANGUAGE property for this target.";
      cmake* cm = this->Target->GetLocalGenerator()->GetCMakeInstance();
      cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                       this->Target->GetBacktrace());
    }
    return *this->Preferred.begin();
  }